

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

Testlist * __thiscall Parser::arrayInit(Parser *this)

{
  undefined8 uVar1;
  bool bVar2;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  undefined1 local_88 [8];
  Token closeBrace;
  Testlist *arrayTestlist;
  Parser *this_local;
  
  closeBrace._string.field_2._8_8_ = testList(this);
  Tokenizer::getToken((Token *)local_88,this->tokenizer);
  bVar2 = Token::isCloseBrace((Token *)local_88);
  if (!bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"Parser::arrayInit",&local_b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"Expected an ] sign, instead got",&local_e1);
    die(this,&local_b8,&local_e0,(Token *)local_88);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
  }
  uVar1 = closeBrace._string.field_2._8_8_;
  Token::~Token((Token *)local_88);
  return (Testlist *)uVar1;
}

Assistant:

Testlist *Parser::arrayInit() {
//    Token openBrace = tokenizer.getToken();
//    if (!openBrace.isOpenBrace())
//        die("Parser::arrayInit", "Expected an [ sign, instead got", openBrace);
    Testlist * arrayTestlist = testList();
    Token closeBrace = tokenizer.getToken();
    if (!closeBrace.isCloseBrace())
        die("Parser::arrayInit", "Expected an ] sign, instead got", closeBrace);
    return arrayTestlist;
}